

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

void __thiscall helics::apps::Tracer::generateInterfaces(Tracer *this)

{
  string_view key;
  bool bVar1;
  reference ppVar2;
  _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
  *in_RDI;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int> *tag;
  iterator __end2;
  iterator __begin2;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *__range2;
  Tracer *in_stack_00000130;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_20;
  _Self local_18;
  _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
  *local_10;
  
  local_10 = in_RDI + 0x20;
  local_18._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_20._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = CLI::std::operator==(&local_18,&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVar2 = CLI::std::
             _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                          *)0x2437dd);
    if (ppVar2->second == -1) {
      key._M_str = (char *)this;
      key._M_len = (size_t)__range2;
      addSubscription((Tracer *)__begin2._M_node,key);
    }
    CLI::std::
    _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
    ::operator++(in_RDI);
  }
  loadCaptureInterfaces(in_stack_00000130);
  return;
}

Assistant:

void Tracer::generateInterfaces()
{
    for (auto& tag : subkeys) {
        if (tag.second == -1) {
            addSubscription(tag.first);
        }
    }

    loadCaptureInterfaces();
}